

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_parser_parseCommaExpression(sysbvm_context_t *context,sysbvm_parser_state_t *state)

{
  size_t startIndex;
  sysbvm_tuple_t sVar1;
  size_t sVar2;
  size_t sVar3;
  _Bool _Var4;
  int iVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t tuple;
  sysbvm_tuple_t sVar7;
  size_t endPosition;
  sysbvm_tuple_t nextElement;
  sysbvm_parser_state_t savedState;
  sysbvm_tuple_t elements;
  sysbvm_tuple_t firstElement;
  size_t startPosition;
  sysbvm_parser_state_t *state_local;
  sysbvm_context_t *context_local;
  
  startIndex = state->tokenPosition;
  context_local = (sysbvm_context_t *)sysbvm_parser_parseCommaExpressionElement(context,state);
  iVar5 = sysbvm_parser_lookKindAt(state,0);
  if (iVar5 == 0x17) {
    sVar6 = sysbvm_orderedCollection_create(context);
    sysbvm_orderedCollection_add(context,sVar6,(sysbvm_tuple_t)context_local);
    while (iVar5 = sysbvm_parser_lookKindAt(state,0), iVar5 == 0x17) {
      state->tokenPosition = state->tokenPosition + 1;
      sVar7 = state->sourceCode;
      sVar1 = state->tokenSequence;
      sVar2 = state->tokenPosition;
      sVar3 = state->tokenSequenceSize;
      tuple = sysbvm_parser_parseCommaExpressionElement(context,state);
      if ((tuple == 0) || (_Var4 = sysbvm_astNode_isErrorNode(context,tuple), _Var4)) {
        state->sourceCode = sVar7;
        state->tokenSequence = sVar1;
        state->tokenPosition = sVar2;
        state->tokenSequenceSize = sVar3;
        break;
      }
      sysbvm_orderedCollection_add(context,sVar6,tuple);
    }
    sVar7 = sysbvm_parser_makeSourcePositionForTokenRange
                      (context,state->sourceCode,state->tokenSequence,startIndex,
                       state->tokenPosition);
    sVar6 = sysbvm_orderedCollection_asArray(context,sVar6);
    context_local = (sysbvm_context_t *)sysbvm_astMakeArrayNode_create(context,sVar7,sVar6);
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_parser_parseCommaExpression(sysbvm_context_t *context, sysbvm_parser_state_t *state)
{
    size_t startPosition = state->tokenPosition;
    sysbvm_tuple_t firstElement = sysbvm_parser_parseCommaExpressionElement(context, state);
    if(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COMMA)
    {
        sysbvm_tuple_t elements = sysbvm_orderedCollection_create(context);
        sysbvm_orderedCollection_add(context, elements, firstElement);

        while(sysbvm_parser_lookKindAt(state, 0) == SYSBVM_TOKEN_KIND_COMMA)
        {
            ++state->tokenPosition;
            sysbvm_parser_state_t savedState = *state;
            sysbvm_tuple_t nextElement = sysbvm_parser_parseCommaExpressionElement(context, state);
            if(!nextElement || sysbvm_astNode_isErrorNode(context, nextElement))
            {
                *state = savedState;
                break;
            }
            sysbvm_orderedCollection_add(context, elements, nextElement);
        }

        size_t endPosition = state->tokenPosition;
        return sysbvm_astMakeArrayNode_create(context,
            sysbvm_parser_makeSourcePositionForTokenRange(context, state->sourceCode, state->tokenSequence, startPosition, endPosition),
            sysbvm_orderedCollection_asArray(context, elements));
    }
    else
    {
        return firstElement;
    }
}